

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::RowGroup::read(RowGroup *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  reference pvVar7;
  reference pvVar8;
  undefined8 uVar9;
  undefined4 in_register_00000034;
  uint32_t _i149;
  TType _etype148;
  uint32_t _size145;
  uint32_t _i144;
  TType _etype143;
  uint32_t _size140;
  bool isset_num_rows;
  bool isset_total_byte_size;
  bool isset_columns;
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  undefined4 in_stack_fffffffffffffed8;
  TProtocolExceptionType in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  string *in_stack_fffffffffffffee8;
  TProtocol *in_stack_fffffffffffffef0;
  size_type in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff04;
  uint local_70;
  uint local_68;
  uint local_64;
  uint local_5c;
  undefined2 local_46;
  int local_44;
  string local_40 [36];
  uint local_1c;
  undefined8 local_10;
  RowGroup *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  duckdb_apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
             ,(TProtocol *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_1c = 0;
  std::__cxx11::string::string(local_40);
  uVar4 = duckdb_apache::thrift::protocol::TProtocol::readStructBegin
                    ((TProtocol *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     (string *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  local_1c = uVar4 + local_1c;
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  while( true ) {
    uVar4 = duckdb_apache::thrift::protocol::TProtocol::readFieldBegin
                      (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                       (TType *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (int16_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    local_1c = uVar4 + local_1c;
    if (local_44 == 0) break;
    switch(local_46) {
    case 1:
      if (local_44 == 0xf) {
        duckdb::vector<duckdb_parquet::ColumnChunk,_true>::clear
                  ((vector<duckdb_parquet::ColumnChunk,_true> *)0x714ba8);
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::readListBegin
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           (TType *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                           (uint32_t *)0x714bc5);
        local_1c = local_1c + uVar4;
        std::vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>::
        resize((vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
        for (local_64 = 0; local_64 < local_5c; local_64 = local_64 + 1) {
          pvVar7 = duckdb::vector<duckdb_parquet::ColumnChunk,_true>::operator[]
                             ((vector<duckdb_parquet::ColumnChunk,_true> *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                              CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          iVar5 = (**(code **)(*(long *)pvVar7 + 0x10))(pvVar7,local_10);
          local_1c = iVar5 + local_1c;
        }
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::readListEnd((TProtocol *)0x714c91);
        local_1c = uVar4 + local_1c;
        bVar1 = true;
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           in_stack_fffffffffffffedc);
        local_1c = uVar4 + local_1c;
      }
      break;
    case 2:
      if (local_44 == 10) {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::readI64
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           (int64_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
        ;
        local_1c = uVar4 + local_1c;
        bVar2 = true;
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           in_stack_fffffffffffffedc);
        local_1c = uVar4 + local_1c;
      }
      break;
    case 3:
      if (local_44 == 10) {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::readI64
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           (int64_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
        ;
        local_1c = uVar4 + local_1c;
        bVar3 = true;
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           in_stack_fffffffffffffedc);
        local_1c = uVar4 + local_1c;
      }
      break;
    case 4:
      if (local_44 == 0xf) {
        duckdb::vector<duckdb_parquet::SortingColumn,_true>::clear
                  ((vector<duckdb_parquet::SortingColumn,_true> *)0x714def);
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::readListBegin
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           (TType *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                           (uint32_t *)0x714e0c);
        local_1c = local_1c + uVar4;
        std::vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>::
        resize((vector<duckdb_parquet::SortingColumn,_std::allocator<duckdb_parquet::SortingColumn>_>
                *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
        for (local_70 = 0; local_70 < local_68; local_70 = local_70 + 1) {
          pvVar8 = duckdb::vector<duckdb_parquet::SortingColumn,_true>::operator[]
                             ((vector<duckdb_parquet::SortingColumn,_true> *)
                              CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                              CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          iVar5 = (**(code **)(*(long *)pvVar8 + 0x10))(pvVar8,local_10);
          local_1c = iVar5 + local_1c;
        }
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::readListEnd((TProtocol *)0x714ecc);
        local_1c = uVar4 + local_1c;
        this->__isset = (_RowGroup__isset)((byte)this->__isset & 0xfe | 1);
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           in_stack_fffffffffffffedc);
        local_1c = uVar4 + local_1c;
      }
      break;
    case 5:
      if (local_44 == 10) {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::readI64
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           (int64_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
        ;
        local_1c = uVar4 + local_1c;
        this->__isset = (_RowGroup__isset)((byte)this->__isset & 0xfd | 2);
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           in_stack_fffffffffffffedc);
        local_1c = uVar4 + local_1c;
      }
      break;
    case 6:
      if (local_44 == 10) {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::readI64
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           (int64_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
        ;
        local_1c = uVar4 + local_1c;
        this->__isset = (_RowGroup__isset)((byte)this->__isset & 0xfb | 4);
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           in_stack_fffffffffffffedc);
        local_1c = uVar4 + local_1c;
      }
      break;
    case 7:
      if (local_44 == 6) {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::readI16
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           (int16_t *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
        ;
        local_1c = uVar4 + local_1c;
        this->__isset = (_RowGroup__isset)((byte)this->__isset & 0xf7 | 8);
      }
      else {
        uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                          ((TProtocol *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           in_stack_fffffffffffffedc);
        local_1c = uVar4 + local_1c;
      }
      break;
    default:
      uVar4 = duckdb_apache::thrift::protocol::TProtocol::skip
                        ((TProtocol *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                         in_stack_fffffffffffffedc);
      local_1c = uVar4 + local_1c;
    }
    in_stack_ffffffffffffff04 =
         duckdb_apache::thrift::protocol::TProtocol::readFieldEnd((TProtocol *)0x7150e7);
    local_1c = in_stack_ffffffffffffff04 + local_1c;
  }
  uVar4 = duckdb_apache::thrift::protocol::TProtocol::readStructEnd((TProtocol *)0x715111);
  uVar6 = uVar4 + local_1c;
  local_1c = uVar6;
  if (!bVar1) {
    uVar9 = __cxa_allocate_exception(0x30);
    duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
              ((TProtocolException *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffedc);
    __cxa_throw(uVar9,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  if (!bVar2) {
    uVar9 = __cxa_allocate_exception(0x30);
    duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
              ((TProtocolException *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffedc);
    __cxa_throw(uVar9,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  if (bVar3) {
    std::__cxx11::string::~string(local_40);
    duckdb_apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
              ((TInputRecursionTracker *)0x715289);
    return (ulong)uVar6;
  }
  uVar9 = __cxa_allocate_exception(0x30);
  duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
            ((TProtocolException *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             in_stack_fffffffffffffedc);
  __cxa_throw(uVar9,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
              duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
}

Assistant:

uint32_t RowGroup::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_columns = false;
  bool isset_total_byte_size = false;
  bool isset_num_rows = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->columns.clear();
            uint32_t _size140;
            ::apache::thrift::protocol::TType _etype143;
            xfer += iprot->readListBegin(_etype143, _size140);
            this->columns.resize(_size140);
            uint32_t _i144;
            for (_i144 = 0; _i144 < _size140; ++_i144)
            {
              xfer += this->columns[_i144].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          isset_columns = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->total_byte_size);
          isset_total_byte_size = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->num_rows);
          isset_num_rows = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->sorting_columns.clear();
            uint32_t _size145;
            ::apache::thrift::protocol::TType _etype148;
            xfer += iprot->readListBegin(_etype148, _size145);
            this->sorting_columns.resize(_size145);
            uint32_t _i149;
            for (_i149 = 0; _i149 < _size145; ++_i149)
            {
              xfer += this->sorting_columns[_i149].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.sorting_columns = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->file_offset);
          this->__isset.file_offset = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->total_compressed_size);
          this->__isset.total_compressed_size = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 7:
        if (ftype == ::apache::thrift::protocol::T_I16) {
          xfer += iprot->readI16(this->ordinal);
          this->__isset.ordinal = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_columns)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_total_byte_size)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_num_rows)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}